

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlogin.c
# Opt level: O3

void rlogin_closing(Plug *plug,PlugCloseType type,char *error_msg)

{
  if (plug[-10].vt != (PlugVtable *)0x0) {
    (**(code **)((plug[-10].vt)->log + 8))();
    plug[-10].vt = (PlugVtable *)0x0;
    if (error_msg != (char *)0x0) {
      *(undefined1 *)&plug[-9].vt = 1;
    }
    (**(code **)((plug[-6].vt)->log + 0x30))();
    (**(code **)((plug[-6].vt)->log + 0x38))();
  }
  if (type != PLUGCLOSE_NORMAL) {
    logevent((LogContext *)plug[-5].vt,error_msg);
    if (type != PLUGCLOSE_USER_ABORT) {
      seat_connection_fatal((Seat *)plug[-6].vt,"%s",error_msg);
      return;
    }
  }
  return;
}

Assistant:

static void rlogin_closing(Plug *plug, PlugCloseType type,
                           const char *error_msg)
{
    Rlogin *rlogin = container_of(plug, Rlogin, plug);

    /*
     * We don't implement independent EOF in each direction for Telnet
     * connections; as soon as we get word that the remote side has
     * sent us EOF, we wind up the whole connection.
     */

    if (rlogin->s) {
        sk_close(rlogin->s);
        rlogin->s = NULL;
        if (error_msg)
            rlogin->closed_on_socket_error = true;
        seat_notify_remote_exit(rlogin->seat);
        seat_notify_remote_disconnect(rlogin->seat);
    }
    if (type != PLUGCLOSE_NORMAL) {
        /* A socket error has occurred. */
        logevent(rlogin->logctx, error_msg);
        if (type != PLUGCLOSE_USER_ABORT)
            seat_connection_fatal(rlogin->seat, "%s", error_msg);
    }
    /* Otherwise, the remote side closed the connection normally. */
}